

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O3

float __thiscall Input::lr(Input *this)

{
  float fVar1;
  bool bVar2;
  char cVar3;
  
  bVar2 = is_joypad_connected();
  if (bVar2) {
    if (this->joypad_l != false) {
      return -1.0;
    }
    if (this->joypad_r != false) {
      return 1.0;
    }
  }
  else {
    cVar3 = al_key_down(&this->kbdstate,0x52);
    if (cVar3 != '\0') {
      return -1.0;
    }
    cVar3 = al_key_down(&this->kbdstate,0x53);
    if (cVar3 != '\0') {
      return 1.0;
    }
    if ((this->joystick != (ALLEGRO_JOYSTICK *)0x0) &&
       (fVar1 = (this->joystate).stick[0].axis[0], 0.1 < ABS(fVar1))) {
      return fVar1;
    }
  }
  return 0.0;
}

Assistant:

float Input::lr(void)
{
   if (is_joypad_connected()) {
      if (joypad_l) return -1;
      if (joypad_r) return 1;
      return 0;
   }

#ifdef ALLEGRO_IPHONE
   if (button_pressed(0, BB_H-size, size, size))
      return -1;
   return button_pressed(size, BB_H-size, size, size) ? 1 : 0;
#else
   if (al_key_down(&kbdstate, ALLEGRO_KEY_LEFT))
      return -1.0f;
   else if (al_key_down(&kbdstate, ALLEGRO_KEY_RIGHT))
      return 1.0f;
   else if (joystick) {
      float pos = joystate.stick[0].axis[0];
      return fabs(pos) > 0.1 ? pos : 0;
   }
   else
      return 0;
#endif
}